

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

wchar_t write_dot_dot_entry(archive_write *a,mtree_entry_conflict *n)

{
  mtree_writer *mtree;
  ulong length;
  wchar_t wVar1;
  char *pcVar2;
  int iVar3;
  
  mtree = (mtree_writer *)a->format_data;
  pcVar2 = (n->parentdir).s;
  if (pcVar2 != (char *)0x0) {
    if (mtree->indent != L'\0') {
      iVar3 = 0;
      if (0 < mtree->depth << 2) {
        iVar3 = mtree->depth << 2;
      }
      while (iVar3 != 0) {
        archive_strappend_char(&mtree->buf,' ');
        iVar3 = iVar3 + -1;
      }
      pcVar2 = (n->parentdir).s;
    }
    archive_string_sprintf(&mtree->buf,"# %s/%s\n",pcVar2,(n->basename).s);
  }
  if (mtree->indent == L'\0') {
    archive_strncat(&mtree->buf,"..\n\n",(ulong)(mtree->dironly == L'\0') + 3);
  }
  else {
    (mtree->ebuf).length = 0;
    archive_strncat(&mtree->ebuf,"..\n\n",(ulong)(mtree->dironly == L'\0') + 3);
    mtree_indent(mtree);
  }
  length = (mtree->buf).length;
  if (length < 0x8001) {
    wVar1 = L'\0';
  }
  else {
    wVar1 = __archive_write_output(a,(mtree->buf).s,length);
    (mtree->buf).length = 0;
  }
  return wVar1;
}

Assistant:

static int
write_dot_dot_entry(struct archive_write *a, struct mtree_entry *n)
{
	struct mtree_writer *mtree = a->format_data;
	int ret;

	if (n->parentdir.s) {
		if (mtree->indent) {
			int i, pd = mtree->depth * 4;
			for (i = 0; i < pd; i++)
				archive_strappend_char(&mtree->buf, ' ');
		}
		archive_string_sprintf(&mtree->buf, "# %s/%s\n",
			n->parentdir.s, n->basename.s);
	}

	if (mtree->indent) {
		archive_string_empty(&mtree->ebuf);
		archive_strncat(&mtree->ebuf, "..\n\n", (mtree->dironly)?3:4);
		mtree_indent(mtree);
	} else
		archive_strncat(&mtree->buf, "..\n\n", (mtree->dironly)?3:4);

	if (mtree->buf.length > 32768) {
		ret = __archive_write_output(
			a, mtree->buf.s, mtree->buf.length);
		archive_string_empty(&mtree->buf);
	} else
		ret = ARCHIVE_OK;
	return (ret);
}